

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCone.cpp
# Opt level: O2

void __thiscall chrono::geometry::ChCone::ArchiveOUT(ChCone *this,ChArchiveOut *marchive)

{
  ChNameValue<chrono::ChVector<double>_> local_48;
  ChNameValue<chrono::ChVector<double>_> local_30;
  
  ChArchiveOut::VersionWrite<chrono::geometry::ChCone>(marchive);
  ChGeometry::ArchiveOUT(&this->super_ChGeometry,marchive);
  local_30._value = &this->center;
  local_30._name = "center";
  local_30._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_30);
  local_48._value = &this->rad;
  local_48._name = "rad";
  local_48._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_48);
  return;
}

Assistant:

void ChCone::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChCone>();
    // serialize parent class
    ChGeometry::ArchiveOUT(marchive);
    // serialize all member data:
    marchive << CHNVP(center);
    marchive << CHNVP(rad);
}